

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall cmComputeLinkInformation::AddExternalObjectTargets(cmComputeLinkInformation *this)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  reference ppcVar2;
  ulong uVar3;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  cmListFileBacktrace local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_178;
  cmLinkItem local_148;
  cmLinkItem *local_e0;
  cmLinkItem *objItem;
  undefined1 local_d0;
  _Base_ptr local_c8;
  undefined1 local_c0;
  undefined4 local_b4;
  string local_b0;
  value_type *local_90;
  string *objLib;
  cmSourceFile *externalObject;
  iterator __end1;
  iterator __begin1;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  undefined1 local_28 [8];
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> externalObjects;
  cmComputeLinkInformation *this_local;
  
  externalObjects.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_28);
  cmGeneratorTarget::GetExternalObjects
            (this->Target,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_28,
             &this->Config);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&__range1);
  __end1 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                     ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                      local_28);
  externalObject =
       (cmSourceFile *)
       std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                 ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_28);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                                     *)&externalObject), bVar1) {
    ppcVar2 = __gnu_cxx::
              __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
              ::operator*(&__end1);
    objLib = (string *)*ppcVar2;
    cmSourceFile::GetObjectLibrary_abi_cxx11_(&local_b0,(cmSourceFile *)objLib);
    local_90 = &local_b0;
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      pVar4 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range1,local_90);
      objItem = (cmLinkItem *)pVar4.first._M_node;
      local_d0 = pVar4.second;
      local_c8 = (_Base_ptr)objItem;
      local_c0 = local_d0;
      if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        this_00 = this->Target;
        std::__cxx11::string::string((string *)&local_198,(string *)local_90);
        local_1a8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_1a8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmListFileBacktrace::cmListFileBacktrace(&local_1a8);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                  (&local_178,&local_198,&local_1a8);
        cmGeneratorTarget::ResolveLinkItem
                  (&local_148,this_00,&local_178,&cmLinkItem::DEFAULT_abi_cxx11_);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                  (&local_178);
        cmListFileBacktrace::~cmListFileBacktrace(&local_1a8);
        std::__cxx11::string::~string((string *)&local_198);
        local_e0 = &local_148;
        if (local_148.Target != (cmGeneratorTarget *)0x0) {
          std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>::
          emplace_back<cmGeneratorTarget_const*const&>
                    ((vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *)
                     &this->ExternalObjectTargets,&local_148.Target);
        }
        cmLinkItem::~cmLinkItem(&local_148);
      }
      local_b4 = 0;
    }
    else {
      local_b4 = 3;
    }
    std::__cxx11::string::~string((string *)&local_b0);
    __gnu_cxx::
    __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
    ::operator++(&__end1);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&__range1);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_28);
  return;
}

Assistant:

void cmComputeLinkInformation::AddExternalObjectTargets()
{
  std::vector<cmSourceFile const*> externalObjects;
  this->Target->GetExternalObjects(externalObjects, this->Config);
  std::set<std::string> emitted;
  for (auto const* externalObject : externalObjects) {
    std::string const& objLib = externalObject->GetObjectLibrary();
    if (objLib.empty()) {
      continue;
    }
    if (emitted.insert(objLib).second) {
      cmLinkItem const& objItem =
        this->Target->ResolveLinkItem(BT<std::string>(objLib));
      if (objItem.Target) {
        this->ExternalObjectTargets.emplace_back(objItem.Target);
      }
    }
  }
}